

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O2

Insertion_return * __thiscall
Gudhi::persistence_matrix::
Matrix<Chain_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false,false>>
::insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
          (Insertion_return *__return_storage_ptr__,
          Matrix<Chain_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false,false>>
          *this,ID_index cellIndex,
          initializer_list<std::pair<unsigned_int,_unsigned_int>_> *boundary,Dimension dim)

{
  logic_error *this_00;
  
  if (**(int **)this != -1) {
    Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false,false>>>
    ::insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
              (__return_storage_ptr__,
               (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false,false>>>
                *)(this + 8),cellIndex,boundary,dim);
    return __return_storage_ptr__;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            (this_00,
             "Matrix::insert_boundary - Columns cannot be initialized if the coefficient field characteristic is not specified."
            );
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

inline typename Matrix<PersistenceMatrixOptions>::Insertion_return
Matrix<PersistenceMatrixOptions>::insert_boundary(ID_index cellIndex,
                                                  const Boundary_range& boundary,
                                                  Dimension dim)
{
  if constexpr (!PersistenceMatrixOptions::is_z2){
    GUDHI_CHECK(colSettings_->operators.get_characteristic() != get_null_value<Characteristic>(),
                std::logic_error("Matrix::insert_boundary - Columns cannot be initialized if the coefficient field "
                                 "characteristic is not specified."));
  }

  static_assert(isNonBasic, "Only enabled for non-basic matrices.");
  if constexpr (!PersistenceMatrixOptions::is_of_boundary_type &&
                PersistenceMatrixOptions::column_indexation_type == Column_indexation_types::CONTAINER)
    return matrix_.insert_boundary(cellIndex, boundary, dim);
  else
    matrix_.insert_boundary(cellIndex, boundary, dim);
}